

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord1.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::ConeRecord1::Encode(ConeRecord1 *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  ConeRecord1 *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui16Length);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Index);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Padding);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Loc).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Ori).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32Height);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32PeakAngle);
  KDataStream::operator<<(pKVar1,this->m_ui32Padding);
  return;
}

Assistant:

void ConeRecord1::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_Loc
           << KDIS_STREAM m_Ori
           << m_f32Height
           << m_f32PeakAngle
           << m_ui32Padding;
}